

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program_t.cpp
# Opt level: O3

source_t * deci::AssembleProgram(source_t *__return_storage_ptr__,istream *input)

{
  pointer *ppcVar1;
  iterator iVar2;
  pointer pcVar3;
  double val;
  char *__s1;
  long lVar4;
  int iVar5;
  undefined4 uVar6;
  undefined4 extraout_var;
  value_t *pvVar7;
  size_t sVar8;
  mapped_type *pmVar9;
  binop_t<deci::sum_xclass_t> *pbVar10;
  undefined4 extraout_var_00;
  string *psVar11;
  iterator iVar12;
  runtime_error *this;
  string *psVar13;
  pointer pcVar14;
  string opcodeToken;
  string labelToken;
  string argToken;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  labels;
  char *local_110;
  long local_108;
  char local_100 [16];
  string_t local_f0;
  string *local_c0;
  undefined8 local_b8;
  undefined1 local_b0 [32];
  value_t *pvStack_90;
  string local_88;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_68;
  
  (__return_storage_ptr__->super__Vector_base<deci::command_t,_std::allocator<deci::command_t>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<deci::command_t,_std::allocator<deci::command_t>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<deci::command_t,_std::allocator<deci::command_t>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68._M_buckets = &local_68._M_single_bucket;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  do {
    if (((byte)input[*(long *)(*(long *)input + -0x18) + 0x20] & 2) != 0) break;
    local_108 = 0;
    local_100[0] = '\0';
    local_110 = local_100;
    std::operator>>(input,(string *)&local_110);
    lVar4 = local_108;
    __s1 = local_110;
    if (local_108 != 0) {
      iVar5 = strcasecmp(local_110,"nop");
      if (iVar5 == 0) {
        uVar6 = 0;
LAB_00108639:
        local_c0 = (string *)local_b0;
        local_b8 = 0;
        local_b0[0] = 0;
        std::operator>>(input,(string *)&local_c0);
        psVar11 = local_c0;
        local_b0._24_4_ = uVar6;
        if ((byte)(*(char *)&(local_c0->_M_dataplus)._M_p - 0x30U) < 10) {
          val = atof((char *)local_c0);
          number_t::number_t((number_t *)&local_f0,val);
          pvVar7 = number_t::Copy((number_t *)&local_f0);
          number_t::~number_t((number_t *)&local_f0);
        }
        else {
          iVar5 = strcasecmp((char *)local_c0,"sum");
          if (iVar5 == 0) {
            pbVar10 = binop_t<deci::sum_xclass_t>::Instance();
          }
          else {
            iVar5 = strcasecmp((char *)psVar11,"sub");
            if (iVar5 == 0) {
              pbVar10 = (binop_t<deci::sum_xclass_t> *)binop_t<deci::sub_xclass_t>::Instance();
            }
            else {
              iVar5 = strcasecmp((char *)psVar11,"mul");
              if (iVar5 == 0) {
                pbVar10 = (binop_t<deci::sum_xclass_t> *)binop_t<deci::mul_xclass_t>::Instance();
              }
              else {
                iVar5 = strcasecmp((char *)psVar11,"div");
                if (iVar5 == 0) {
                  pbVar10 = (binop_t<deci::sum_xclass_t> *)binop_t<deci::div_xclass_t>::Instance();
                }
                else {
                  iVar5 = strcasecmp((char *)psVar11,"ls");
                  if (iVar5 == 0) {
                    pbVar10 = (binop_t<deci::sum_xclass_t> *)binop_t<deci::ls_xclass_t>::Instance();
                  }
                  else {
                    iVar5 = strcasecmp((char *)psVar11,"gr");
                    if (iVar5 == 0) {
                      pbVar10 = (binop_t<deci::sum_xclass_t> *)
                                binop_t<deci::gr_xclass_t>::Instance();
                    }
                    else {
                      iVar5 = strcasecmp((char *)psVar11,"le");
                      if (iVar5 == 0) {
                        pbVar10 = (binop_t<deci::sum_xclass_t> *)
                                  binop_t<deci::le_xclass_t>::Instance();
                      }
                      else {
                        iVar5 = strcasecmp((char *)psVar11,"ge");
                        if (iVar5 == 0) {
                          pbVar10 = (binop_t<deci::sum_xclass_t> *)
                                    binop_t<deci::ge_xclass_t>::Instance();
                        }
                        else {
                          iVar5 = strcasecmp((char *)psVar11,"eq");
                          if (iVar5 == 0) {
                            pbVar10 = (binop_t<deci::sum_xclass_t> *)
                                      binop_t<deci::eq_xclass_t>::Instance();
                          }
                          else {
                            iVar5 = strcasecmp((char *)psVar11,"neq");
                            if (iVar5 == 0) {
                              pbVar10 = (binop_t<deci::sum_xclass_t> *)
                                        binop_t<deci::neq_xclass_t>::Instance();
                            }
                            else {
                              iVar5 = strcasecmp((char *)psVar11,"or");
                              if (iVar5 == 0) {
                                pbVar10 = (binop_t<deci::sum_xclass_t> *)
                                          binop_t<deci::or_xclass_t>::Instance();
                              }
                              else {
                                iVar5 = strcasecmp((char *)psVar11,"and");
                                if (iVar5 == 0) {
                                  pbVar10 = (binop_t<deci::sum_xclass_t> *)
                                            binop_t<deci::and_xclass_t>::Instance();
                                }
                                else {
                                  iVar5 = strcasecmp((char *)psVar11,"xor");
                                  if (iVar5 == 0) {
                                    pbVar10 = (binop_t<deci::sum_xclass_t> *)
                                              binop_t<deci::xor_xclass_t>::Instance();
                                  }
                                  else {
                                    iVar5 = strcasecmp((char *)psVar11,"pow");
                                    if (iVar5 == 0) {
                                      pbVar10 = (binop_t<deci::sum_xclass_t> *)
                                                binop_t<deci::pow_xclass_t>::Instance();
                                    }
                                    else {
                                      iVar5 = strcasecmp((char *)psVar11,"mod");
                                      if (iVar5 == 0) {
                                        pbVar10 = (binop_t<deci::sum_xclass_t> *)
                                                  binop_t<deci::mod_xclass_t>::Instance();
                                      }
                                      else {
                                        iVar5 = strcasecmp((char *)psVar11,"not");
                                        if (iVar5 == 0) {
                                          pbVar10 = (binop_t<deci::sum_xclass_t> *)
                                                    unrop_t<deci::not_xclass_t>::Instance();
                                        }
                                        else {
                                          iVar5 = strcasecmp((char *)psVar11,"neg");
                                          if (iVar5 == 0) {
                                            pbVar10 = (binop_t<deci::sum_xclass_t> *)
                                                      unrop_t<deci::neg_xclass_t>::Instance();
                                          }
                                          else {
                                            iVar5 = strcasecmp((char *)psVar11,"print");
                                            if (iVar5 != 0) {
                                              local_88._M_dataplus._M_p = (pointer)&local_88.field_2
                                              ;
                                              sVar8 = strlen((char *)psVar11);
                                              std::__cxx11::string::_M_construct<char_const*>
                                                        ((string *)&local_88,psVar11,
                                                         (long)&(psVar11->_M_dataplus)._M_p + sVar8)
                                              ;
                                              string_t::string_t(&local_f0,&local_88);
                                              pvVar7 = string_t::Copy(&local_f0);
                                              string_t::~string_t(&local_f0);
                                              if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)local_88._M_dataplus._M_p != &local_88.field_2)
                                              {
                                                operator_delete(local_88._M_dataplus._M_p);
                                              }
                                              goto LAB_001089b9;
                                            }
                                            pbVar10 = (binop_t<deci::sum_xclass_t> *)
                                                      print_t::Instance();
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
          iVar5 = (*(pbVar10->super_function_t).super_value_t._vptr_value_t[2])(pbVar10);
          pvVar7 = (value_t *)CONCAT44(extraout_var_00,iVar5);
        }
LAB_001089b9:
        iVar2._M_current =
             (__return_storage_ptr__->
             super__Vector_base<deci::command_t,_std::allocator<deci::command_t>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        pvStack_90 = pvVar7;
        if (iVar2._M_current ==
            (__return_storage_ptr__->
            super__Vector_base<deci::command_t,_std::allocator<deci::command_t>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<deci::command_t,_std::allocator<deci::command_t>_>::
          _M_realloc_insert<deci::command_t>
                    (__return_storage_ptr__,iVar2,(command_t *)(local_b0 + 0x18));
        }
        else {
          *(ulong *)iVar2._M_current = CONCAT44(local_b0._28_4_,local_b0._24_4_);
          (iVar2._M_current)->arg = pvVar7;
          ppcVar1 = &(__return_storage_ptr__->
                     super__Vector_base<deci::command_t,_std::allocator<deci::command_t>_>)._M_impl.
                     super__Vector_impl_data._M_finish;
          *ppcVar1 = *ppcVar1 + 1;
        }
        psVar11 = (string *)local_b0;
        psVar13 = local_c0;
      }
      else {
        iVar5 = strcasecmp(__s1,"arg");
        if (iVar5 == 0) {
          uVar6 = 1;
          goto LAB_00108639;
        }
        iVar5 = strcasecmp(__s1,"push");
        if (iVar5 == 0) {
          uVar6 = 2;
          goto LAB_00108639;
        }
        iVar5 = strcasecmp(__s1,"resl");
        if (iVar5 == 0) {
          uVar6 = 3;
LAB_001085ac:
          local_f0.super_value_t._vptr_value_t =
               (_func_int **)CONCAT44(local_f0.super_value_t._vptr_value_t._4_4_,uVar6);
          pvVar7 = nothing_t::Instance();
          iVar5 = (*pvVar7->_vptr_value_t[2])(pvVar7);
          local_f0.super_value_t.hash = CONCAT44(extraout_var,iVar5);
          iVar2._M_current =
               (__return_storage_ptr__->
               super__Vector_base<deci::command_t,_std::allocator<deci::command_t>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar2._M_current ==
              (__return_storage_ptr__->
              super__Vector_base<deci::command_t,_std::allocator<deci::command_t>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<deci::command_t,_std::allocator<deci::command_t>_>::
            _M_realloc_insert<deci::command_t>(__return_storage_ptr__,iVar2,(command_t *)&local_f0);
          }
          else {
            *(_func_int ***)iVar2._M_current = local_f0.super_value_t._vptr_value_t;
            (iVar2._M_current)->arg = (value_t *)local_f0.super_value_t.hash;
            ppcVar1 = &(__return_storage_ptr__->
                       super__Vector_base<deci::command_t,_std::allocator<deci::command_t>_>).
                       _M_impl.super__Vector_impl_data._M_finish;
            *ppcVar1 = *ppcVar1 + 1;
          }
          goto LAB_00108a0b;
        }
        iVar5 = strcasecmp(__s1,"drop");
        if (iVar5 == 0) {
          uVar6 = 4;
          goto LAB_00108639;
        }
        iVar5 = strcasecmp(__s1,"call");
        if (iVar5 == 0) {
          uVar6 = 5;
          goto LAB_00108639;
        }
        iVar5 = strcasecmp(__s1,"ret");
        if (iVar5 == 0) {
          uVar6 = 6;
          goto LAB_001085ac;
        }
        iVar5 = strcasecmp(__s1,"bin");
        if (iVar5 == 0) {
          uVar6 = 7;
          goto LAB_00108639;
        }
        iVar5 = strcasecmp(__s1,"rval");
        if (iVar5 == 0) {
          uVar6 = 8;
          goto LAB_00108639;
        }
        iVar5 = strcasecmp(__s1,"set");
        if (iVar5 == 0) {
          uVar6 = 9;
          goto LAB_00108639;
        }
        iVar5 = strcasecmp(__s1,"unr");
        if (iVar5 == 0) {
          uVar6 = 10;
          goto LAB_00108639;
        }
        iVar5 = strcasecmp(__s1,"jz");
        if (iVar5 == 0) {
          uVar6 = 0xb;
          goto LAB_00108639;
        }
        iVar5 = strcasecmp(__s1,"jmp");
        if (iVar5 == 0) {
          uVar6 = 0xc;
          goto LAB_00108639;
        }
        iVar5 = strcasecmp(__s1,":");
        if (iVar5 != 0) {
          iVar5 = strcasecmp(__s1,"jnz");
          uVar6 = 0xe;
          if (iVar5 != 0) {
            this = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(this,"Unknown opcode");
            __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          goto LAB_00108639;
        }
        local_f0.super_value_t._vptr_value_t = (_func_int **)&local_f0.val;
        local_f0.super_value_t.hash = 0;
        local_f0.val._M_dataplus._M_p._0_1_ = 0;
        std::operator>>(input,(string *)&local_f0);
        local_b0._16_8_ =
             (__return_storage_ptr__->
             super__Vector_base<deci::command_t,_std::allocator<deci::command_t>_>)._M_impl.
             super__Vector_impl_data._M_start;
        pcVar14 = (__return_storage_ptr__->
                  super__Vector_base<deci::command_t,_std::allocator<deci::command_t>_>)._M_impl.
                  super__Vector_impl_data._M_finish;
        pmVar9 = std::__detail::
                 _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)&local_68,(key_type *)&local_f0);
        *pmVar9 = (mapped_type)((ulong)((long)pcVar14 - local_b0._16_8_) >> 4);
        psVar11 = &local_f0.val;
        psVar13 = (string *)local_f0.super_value_t._vptr_value_t;
      }
      if (psVar13 != psVar11) {
        operator_delete(psVar13);
      }
    }
LAB_00108a0b:
    if (local_110 != local_100) {
      operator_delete(local_110);
    }
  } while (lVar4 != 0);
  pcVar14 = (__return_storage_ptr__->
            super__Vector_base<deci::command_t,_std::allocator<deci::command_t>_>)._M_impl.
            super__Vector_impl_data._M_start;
  pcVar3 = (__return_storage_ptr__->
           super__Vector_base<deci::command_t,_std::allocator<deci::command_t>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pcVar14 != pcVar3) {
    do {
      iVar5 = (*pcVar14->arg->_vptr_value_t[1])();
      if ((iVar5 == 1) &&
         (iVar12 = std::
                   _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   ::find(&local_68,(key_type *)(pcVar14->arg + 1)),
         iVar12.
         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
         ._M_cur != (__node_type *)0x0)) {
        (*pcVar14->arg->_vptr_value_t[3])();
        number_t::number_t((number_t *)&local_f0,
                           (double)*(int *)((long)iVar12.
                                                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
                                                  ._M_cur + 0x28));
        pvVar7 = number_t::Copy((number_t *)&local_f0);
        pcVar14->arg = pvVar7;
        number_t::~number_t((number_t *)&local_f0);
      }
      pcVar14 = pcVar14 + 1;
    } while (pcVar14 != pcVar3);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_68);
  return __return_storage_ptr__;
}

Assistant:

program_t::source_t AssembleProgram(std::istream& input) {
    program_t::source_t result;
    std::unordered_map<std::string, int> labels;

    while(!input.eof()) {
      std::string opcodeToken;

      input >> opcodeToken;

      if (opcodeToken.size() == 0) {
        break;
      }

      opcode_t opcode = SelectOpcode(opcodeToken.c_str());
      switch (opcode) {
      case OP_UNDEFINED:
        throw std::runtime_error("Unknown opcode");
      case OP_RESULT:
      case OP_RETURN:
        result.push_back({ opcode, nothing_t::Instance().Copy() });
        break;
      case OP_LABEL:
        {
          std::string labelToken;
          input >> labelToken;
          labels[labelToken] = result.size();
          break;
        }
      default:
        {
          std::string argToken;
          input >> argToken;
          result.push_back({ opcode, SelectValue(argToken.c_str()) });
          break;
        }
      }
    }

    // Fix label pointers
    for (auto& item: result) {
      if (item.arg->Type() == value_t::STRING) {
        string_t& str = static_cast<string_t&>(*item.arg);
        auto it = labels.find(str.Value());
        if (it != labels.end()) {
          item.arg->Delete();
          item.arg = number_t(it->second).Copy();
        }
      }
    }

    return result;
  }